

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

value * __thiscall mpt::source<double>::value(source<double> *this)

{
  bool bVar1;
  iterator ptr;
  value *local_30;
  double *val;
  source<double> *this_local;
  
  if ((-1 < this->_pos) &&
     (ptr = span<const_double>::nth(&this->super_span<const_double>,this->_pos),
     ptr != (iterator)0x0)) {
    bVar1 = mpt::value::set(&this->_val,this->_type,ptr);
    if (bVar1) {
      local_30 = &this->_val;
    }
    else {
      local_30 = (value *)0x0;
    }
    return local_30;
  }
  return (value *)0x0;
}

Assistant:

const struct value *value() __MPT_OVERRIDE
	{
		const T *val;
		if (_pos < 0 || !(val = span<const T>::nth(_pos))) {
			return 0;
		}
		return _val.set(_type, val) ? &_val : 0;
	}